

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlGetObjectString(JlDataObject *StringObject,char **pString)

{
  JL_STATUS local_1c;
  JL_STATUS jlStatus;
  char **pString_local;
  JlDataObject *StringObject_local;
  
  if ((StringObject == (JlDataObject *)0x0) || (pString == (char **)0x0)) {
    local_1c = JL_STATUS_INVALID_PARAMETER;
  }
  else if (StringObject->Type == JL_DATA_TYPE_STRING) {
    *pString = (StringObject->field_2).String;
    local_1c = JL_STATUS_SUCCESS;
  }
  else {
    *pString = (char *)0x0;
    local_1c = JL_STATUS_WRONG_TYPE;
  }
  return local_1c;
}

Assistant:

JL_STATUS
    JlGetObjectString
    (
        JlDataObject const* StringObject,
        char const**        pString
    )
{
    JL_STATUS jlStatus;

    if(     NULL != StringObject
        &&  NULL != pString )
    {
        if( JL_DATA_TYPE_STRING == StringObject->Type )
        {
            *pString = StringObject->String;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            *pString = NULL;
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}